

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadBoundThreadContextManager.cpp
# Opt level: O1

void ThreadBoundThreadContextManager::DestroyAllContextsAndEntries(bool shouldDeleteCurrentTlsEntry)

{
  ThreadContextTLSEntry *this;
  BackgroundJobProcessor *buffer;
  ThreadContextTLSEntry *pTVar1;
  ThreadContextTLSEntry **ppTVar2;
  ThreadContext *threadContext;
  undefined7 in_register_00000039;
  
  BGParseManager::DeleteBGParseManager();
  CCLock::Enter(&ThreadContext::s_csThreadContext.super_CCLock);
  if ((int)CONCAT71(in_register_00000039,shouldDeleteCurrentTlsEntry) == 0) {
    pTVar1 = ThreadContextTLSEntry::GetEntryForCurrentThread();
  }
  else {
    pTVar1 = (ThreadContextTLSEntry *)0x0;
  }
  while ((EntryList *)
         entries.super_DListBase<ThreadContextTLSEntry_*,_RealCount>.
         super_DListNodeBase<ThreadContextTLSEntry_*>.next.base != &entries) {
    ppTVar2 = DListBase<ThreadContextTLSEntry_*,_RealCount>::Head
                        (&entries.super_DListBase<ThreadContextTLSEntry_*,_RealCount>);
    this = *ppTVar2;
    threadContext = ThreadContextTLSEntry::GetThreadContext(this);
    DListBase<ThreadContextTLSEntry_*,_RealCount>::RemoveHead<Memory::HeapAllocator>
              (&entries.super_DListBase<ThreadContextTLSEntry_*,_RealCount>,entries.allocator);
    if (threadContext != (ThreadContext *)0x0) {
      ThreadContextManagerBase::ShutdownThreadContext(threadContext,true);
    }
    if (pTVar1 != this) {
      ThreadContextTLSEntry::Delete(this);
    }
  }
  if (s_sharedJobProcessor != (BackgroundJobProcessor *)0x0) {
    JsUtil::BackgroundJobProcessor::Close(s_sharedJobProcessor);
    buffer = s_sharedJobProcessor;
    JsUtil::BackgroundJobProcessor::~BackgroundJobProcessor(s_sharedJobProcessor);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,0xb0);
    s_sharedJobProcessor = (BackgroundJobProcessor *)0x0;
  }
  CCLock::Leave(&ThreadContext::s_csThreadContext.super_CCLock);
  return;
}

Assistant:

void ThreadBoundThreadContextManager::DestroyAllContextsAndEntries(bool shouldDeleteCurrentTlsEntry)
{
    // Since BGParseManager has a dependency on threadcontexts, make sure it shuts down first
    BGParseManager::DeleteBGParseManager();

    AutoCriticalSection lock(ThreadContext::GetCriticalSection());

    // When shouldDeleteCurrentTlsEntry is true, the comparison in the while loop will always be true, so
    // every entry in the list will be deleted.
    ThreadContextTLSEntry* currentThreadEntry = shouldDeleteCurrentTlsEntry ? nullptr : ThreadContextTLSEntry::GetEntryForCurrentThread();

    while (!entries.Empty())
    {
        ThreadContextTLSEntry * entry = entries.Head();
        ThreadContext * threadContext =  static_cast<ThreadContext *>(entry->GetThreadContext());

        entries.RemoveHead();

        if (threadContext != nullptr)
        {
            ShutdownThreadContext(threadContext);
        }

        if (currentThreadEntry != entry)
        {
            // Note: This deletes the ThreadContextTLSEntry but does not remove its pointer
            // from the thread's TLS
            ThreadContextTLSEntry::Delete(entry);
        }
    }

#if ENABLE_BACKGROUND_JOB_PROCESSOR
    if (s_sharedJobProcessor != NULL)
    {
        s_sharedJobProcessor->Close();

        HeapDelete(s_sharedJobProcessor);
        s_sharedJobProcessor = NULL;
    }
#endif
}